

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Converter.cpp
# Opt level: O3

bool __thiscall Process::Converter::setupEnd(Converter *this)

{
  bool bVar1;
  long *plVar2;
  value_type *pvVar3;
  string *s;
  value_type *pvVar4;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  pvVar4 = (value_type *)(local_60 + 0x10);
  local_60._0_8_ = pvVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"rsrc/C/end.txt","");
  bVar1 = Parsing::File::setPath(&this->_f,(string *)local_60);
  if ((value_type *)local_60._0_8_ != pvVar4) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if (bVar1) {
    Parsing::File::getContent_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60,&this->_f);
    if (local_60._0_8_ != local_60._8_8_) {
      pvVar4 = (value_type *)local_60._0_8_;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->_contC,pvVar4);
        pvVar4 = pvVar4 + 1;
      } while (pvVar4 != (value_type *)local_60._8_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40,
                   "Missing file : ",&(this->_f)._path);
    plVar2 = (long *)std::__cxx11::string::append(local_40._M_local_buf);
    pvVar3 = (value_type *)(plVar2 + 2);
    if ((value_type *)*plVar2 == pvVar3) {
      local_60._16_8_ = (pvVar3->_M_dataplus)._M_p;
      local_60._24_8_ = plVar2[3];
      local_60._0_8_ = pvVar4;
    }
    else {
      local_60._16_8_ = (pvVar3->_M_dataplus)._M_p;
      local_60._0_8_ = (value_type *)*plVar2;
    }
    local_60._8_8_ = plVar2[1];
    *plVar2 = (long)pvVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    error(this,(string *)local_60);
    if ((value_type *)local_60._0_8_ != pvVar4) {
      operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_allocated_capacity != &local_30) {
      operator_delete((void *)local_40._M_allocated_capacity,local_30._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool Converter::setupEnd()
    {
        if (!_f.setPath("rsrc/C/end.txt"))
            return error("Missing file : " + _f.getPath() + " in rsrc!");

        for (const std::string &s : _f.getContent())
            _contC.push_back(s);
        return true;
    }